

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::GetArrayType
          (InterfaceVariableScalarReplacement *this,uint32_t elem_type_id,uint32_t array_length)

{
  initializer_list<unsigned_int> __l;
  uint32_t uVar1;
  IRContext *pIVar2;
  TypeManager *pTVar3;
  Type *type;
  ConstantManager *this_00;
  allocator<unsigned_int> local_b1;
  uint local_b0;
  uint32_t local_ac;
  iterator local_a8;
  size_type local_a0;
  LengthInfo local_98;
  undefined1 local_78 [8];
  Array array_type;
  uint32_t array_length_id;
  Type *elem_type;
  uint32_t array_length_local;
  uint32_t elem_type_id_local;
  InterfaceVariableScalarReplacement *this_local;
  
  pIVar2 = Pass::context(&this->super_Pass);
  pTVar3 = IRContext::get_type_mgr(pIVar2);
  type = analysis::TypeManager::GetType(pTVar3,elem_type_id);
  pIVar2 = Pass::context(&this->super_Pass);
  this_00 = IRContext::get_constant_mgr(pIVar2);
  local_98.id = analysis::ConstantManager::GetUIntConstId(this_00,array_length);
  local_b0 = 0;
  local_a8 = &local_b0;
  local_a0 = 2;
  local_ac = array_length;
  array_type.length_info_.words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = local_98.id;
  std::allocator<unsigned_int>::allocator(&local_b1);
  __l._M_len = local_a0;
  __l._M_array = local_a8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_98.words,__l,&local_b1);
  analysis::Array::Array((Array *)local_78,type,&local_98);
  analysis::Array::LengthInfo::~LengthInfo(&local_98);
  std::allocator<unsigned_int>::~allocator(&local_b1);
  pIVar2 = Pass::context(&this->super_Pass);
  pTVar3 = IRContext::get_type_mgr(pIVar2);
  uVar1 = analysis::TypeManager::GetTypeInstruction(pTVar3,(Type *)local_78);
  analysis::Array::~Array((Array *)local_78);
  return uVar1;
}

Assistant:

uint32_t InterfaceVariableScalarReplacement::GetArrayType(
    uint32_t elem_type_id, uint32_t array_length) {
  analysis::Type* elem_type = context()->get_type_mgr()->GetType(elem_type_id);
  uint32_t array_length_id =
      context()->get_constant_mgr()->GetUIntConstId(array_length);
  analysis::Array array_type(
      elem_type,
      analysis::Array::LengthInfo{array_length_id, {0, array_length}});
  return context()->get_type_mgr()->GetTypeInstruction(&array_type);
}